

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O2

void __thiscall pbrt::TransformCache::TransformCache(TransformCache *this)

{
  memory_resource *upstream;
  
  upstream = gpuMemoryAllocator;
  if (*(char *)(Options + 0xf) != '\x01') {
    upstream = pstd::pmr::new_delete_resource();
  }
  pstd::pmr::monotonic_buffer_resource::monotonic_buffer_resource(&this->bufferResource,upstream);
  (this->alloc).memoryResource = (memory_resource *)this;
  (this->hashTable)._M_h._M_buckets = &(this->hashTable)._M_h._M_single_bucket;
  (this->hashTable)._M_h._M_bucket_count = 1;
  (this->hashTable)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->hashTable)._M_h._M_element_count = 0;
  (this->hashTable)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->hashTable)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->hashTable)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

TransformCache()
        : bufferResource(Options->useGPU ? gpuMemoryAllocator.resource()
                                         : Allocator().resource()),
          alloc(&bufferResource) {}